

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

DdNode * cuddHashTableLookup(DdHashTable *hash,DdNodePtr *key)

{
  ptrint *ppVar1;
  int *piVar2;
  DdNodePtr *ppDVar3;
  DdNode **ppDVar4;
  uint keysize;
  DdNode *pDVar5;
  DdHashItem *pDVar6;
  uint uVar7;
  DdHashItem **ppDVar8;
  DdHashItem *pDVar9;
  DdHashItem **ppDVar10;
  ulong uVar11;
  
  keysize = hash->keysize;
  uVar7 = ddLCHash(key,keysize,hash->shift);
  ppDVar8 = hash->bucket;
  pDVar9 = (DdHashItem *)(ppDVar8 + uVar7);
  pDVar6 = (DdHashItem *)(DdHashItem **)0x0;
  do {
    ppDVar10 = &pDVar6->next;
    pDVar9 = pDVar9->next;
    if (pDVar9 == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    uVar11 = 0;
    do {
      if (keysize == uVar11) {
        pDVar5 = pDVar9->value;
        ppVar1 = &pDVar9->count;
        *ppVar1 = *ppVar1 + -1;
        if (*ppVar1 != 0) {
          return pDVar5;
        }
        piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + -1;
        ppDVar8 = ppDVar8 + uVar7;
        if (ppDVar10 != (DdHashItem **)0x0) {
          ppDVar8 = ppDVar10;
        }
        *ppDVar8 = pDVar9->next;
        pDVar9->next = hash->nextFree;
        hash->nextFree = pDVar9;
        hash->size = hash->size - 1;
        return pDVar5;
      }
      ppDVar3 = key + uVar11;
      ppDVar4 = pDVar9->key + uVar11;
      pDVar6 = pDVar9;
      uVar11 = uVar11 + 1;
    } while (*ppDVar3 == *ppDVar4);
  } while( true );
}

Assistant:

DdNode *
cuddHashTableLookup(
  DdHashTable * hash,
  DdNodePtr * key)
{
    unsigned int posn;
    DdHashItem *item, *prev;
    unsigned int i, keysize;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    posn = ddLCHash(key,hash->keysize,hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    keysize = hash->keysize;
    while (item != NULL) {
        DdNodePtr *key2 = item->key;
        int equal = 1;
        for (i = 0; i < keysize; i++) {
            if (key[i] != key2[i]) {
                equal = 0;
                break;
            }
        }
        if (equal) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}